

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_ipfs.c
# Opt level: O1

CURLcode ipfs_url_rewrite(CURLU *uh,char *protocol,char **url,OperationConfig *config)

{
  bool bVar1;
  int iVar2;
  CURLcode CVar3;
  long lVar4;
  long lVar5;
  FILE *__stream;
  size_t sVar6;
  CURLcode CVar7;
  char *pcVar9;
  dynbuf *s;
  char **ppcVar10;
  char *gateway;
  char *ipfs_path;
  char *cid;
  char *inputpath;
  char *gwport;
  char *gwscheme;
  char *gwpath;
  char *gwhost;
  char *gwquery;
  char *cloneurl;
  undefined1 local_a9;
  dynbuf *local_a8;
  char *local_a0;
  long local_98;
  char *local_90;
  undefined8 local_88;
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  char **local_68;
  undefined8 local_60;
  char *local_58;
  dynbuf local_50;
  CURLcode CVar8;
  
  s = (dynbuf *)0x0;
  local_70 = 0;
  local_78 = (char *)0x0;
  local_60 = 0;
  local_80 = 0;
  local_88 = 0;
  local_90 = (char *)0x0;
  local_98 = 0;
  lVar4 = curl_url();
  if (lVar4 == 0) {
    CVar8 = CURLE_FAILED_INIT;
  }
  else {
    local_68 = url;
    iVar2 = curl_url_get(uh,5,&local_98,0x40);
    s = (dynbuf *)0x0;
    CVar8 = CURLE_URL_MALFORMAT;
    CVar7 = CURLE_URL_MALFORMAT;
    if ((iVar2 == 0) && (local_98 != 0)) {
      if (config->ipfs_gateway == (char *)0x0) {
        local_a0 = (char *)0x0;
        local_a8 = (dynbuf *)curl_getenv("IPFS_GATEWAY");
        if (local_a8 == (dynbuf *)0x0) {
          local_a0 = (char *)curl_getenv("IPFS_PATH");
          if (((local_a0 == (char *)0x0) && (pcVar9 = getenv("HOME"), pcVar9 != (char *)0x0)) &&
             (*pcVar9 != '\0')) {
            local_a0 = (char *)curl_maprintf("%s/.ipfs/",pcVar9);
          }
          if ((local_a0 == (char *)0x0) ||
             (CVar3 = ensure_trailing_slash(&local_a0), CVar3 != CURLE_OK)) goto LAB_0011468b;
          __stream = (FILE *)0x0;
          local_58 = local_a0;
          pcVar9 = (char *)curl_maprintf("%sgateway");
          if (pcVar9 != (char *)0x0) {
            __stream = fopen64(pcVar9,"r");
            free(pcVar9);
            if (__stream == (FILE *)0x0) goto LAB_0011468b;
            s = &local_50;
            curlx_dyn_init(s,10000);
            do {
              iVar2 = getc(__stream);
              if ((iVar2 + 1U < 0xf) && ((0x4801U >> (iVar2 + 1U & 0x1f) & 1) != 0)) {
                fclose(__stream);
                sVar6 = curlx_dyn_len(&local_50);
                if (sVar6 != 0) {
                  local_a8 = (dynbuf *)curlx_dyn_ptr(&local_50);
                }
                if (local_a8 != (dynbuf *)0x0) {
                  ensure_trailing_slash((char **)&local_a8);
                }
                s = local_a8;
                if (local_a8 == (dynbuf *)0x0) {
                  bVar1 = true;
                  __stream = (FILE *)0x0;
                }
                else {
                  free(local_58);
                  local_a0 = (char *)0x0;
                  __stream = (FILE *)0x0;
                  bVar1 = false;
                }
                goto LAB_00114ab0;
              }
              local_a9 = (undefined1)iVar2;
              CVar3 = curlx_dyn_addn(s,&local_a9,1);
            } while (CVar3 == CURLE_OK);
            bVar1 = true;
LAB_00114ab0:
            if (!bVar1) goto LAB_001146bc;
          }
LAB_0011468e:
          if (__stream != (FILE *)0x0) {
            fclose(__stream);
          }
          free(local_a8);
          local_a8 = (dynbuf *)0x0;
          free(local_a0);
          local_a0 = (char *)0x0;
          s = (dynbuf *)0x0;
        }
        else {
          CVar3 = ensure_trailing_slash((char **)&local_a8);
          s = local_a8;
          if (CVar3 != CURLE_OK) {
LAB_0011468b:
            __stream = (FILE *)0x0;
            goto LAB_0011468e;
          }
        }
LAB_001146bc:
        if (s == (dynbuf *)0x0) {
          CVar8 = CURLE_FILE_COULDNT_READ_FILE;
          goto LAB_001146e1;
        }
        lVar5 = 0;
        iVar2 = curl_url_set(lVar4,0,s,0);
        if (iVar2 != 0) goto LAB_001146e7;
      }
      else {
        ppcVar10 = &config->ipfs_gateway;
        CVar3 = ensure_trailing_slash(ppcVar10);
        if (CVar3 != CURLE_OK) {
          CVar8 = CURLE_OUT_OF_MEMORY;
LAB_001146e1:
          s = (dynbuf *)0x0;
          goto LAB_001146e4;
        }
        s = (dynbuf *)0x0;
        iVar2 = curl_url_set(lVar4,0,*ppcVar10,0x200);
        if (iVar2 != 0) {
          CVar8 = CURLE_BAD_FUNCTION_ARGUMENT;
          goto LAB_001146e4;
        }
        s = (dynbuf *)strdup(*ppcVar10);
        if (s == (dynbuf *)0x0) goto LAB_001146e1;
      }
      lVar5 = 0;
      iVar2 = curl_url_get(lVar4,8,&local_60,0);
      if (iVar2 != 0x10) goto LAB_001146e7;
      iVar2 = curl_url_get(lVar4,5,&local_70,0x40);
      if ((iVar2 == 0) && (iVar2 = curl_url_get(lVar4,1,&local_80,0x40), iVar2 == 0)) {
        curl_url_get(lVar4,6,&local_88,0x40);
        curl_url_get(lVar4,7,&local_78,0x40);
        curl_url_get(uh,7,&local_90,0x40);
        iVar2 = curl_url_set(uh,1,local_80,0x80);
        if ((iVar2 == 0) &&
           ((iVar2 = curl_url_set(uh,5,local_70,0x80), iVar2 == 0 &&
            (iVar2 = curl_url_set(uh,6,local_88,0x80), iVar2 == 0)))) {
          if ((local_90 != (char *)0x0) && ((*local_90 == '/' && (local_90[1] == '\0')))) {
            *local_90 = '\0';
          }
          ensure_trailing_slash(&local_78);
          pcVar9 = "";
          if (local_90 != (char *)0x0) {
            pcVar9 = local_90;
          }
          lVar5 = curl_maprintf("%s%s/%s%s",local_78,protocol,local_98,pcVar9);
          if (lVar5 != 0) {
            iVar2 = curl_url_set(uh,7,lVar5,0x80);
            ppcVar10 = local_68;
            if (iVar2 == 0) {
              free(*local_68);
              *ppcVar10 = (char *)0x0;
              iVar2 = curl_url_get(uh,0,&local_50,0x80);
              if (iVar2 == 0) {
                pcVar9 = strdup(local_50.bufr);
                ppcVar10 = local_68;
                *local_68 = pcVar9;
                curl_free(local_50.bufr);
                CVar7 = (uint)(*ppcVar10 == (char *)0x0) * 3;
              }
            }
            goto LAB_001146e7;
          }
        }
      }
    }
  }
LAB_001146e4:
  CVar7 = CVar8;
  lVar5 = 0;
LAB_001146e7:
  free(s);
  curl_free(local_70);
  curl_free(local_78);
  curl_free(local_60);
  curl_free(local_90);
  curl_free(local_80);
  curl_free(local_88);
  curl_free(local_98);
  curl_free(lVar5);
  curl_url_cleanup(lVar4);
  if (CVar7 == CURLE_URL_MALFORMAT) {
    pcVar9 = "malformed target URL";
  }
  else if (CVar7 == CURLE_BAD_FUNCTION_ARGUMENT) {
    pcVar9 = "--ipfs-gateway was given a malformed URL";
  }
  else {
    if (CVar7 != CURLE_FILE_COULDNT_READ_FILE) {
      return CVar7;
    }
    pcVar9 = "IPFS automatic gateway detection failed";
  }
  helpf(tool_stderr,pcVar9);
  return CVar7;
}

Assistant:

CURLcode ipfs_url_rewrite(CURLU *uh, const char *protocol, char **url,
                          struct OperationConfig *config)
{
  CURLcode result = CURLE_URL_MALFORMAT;
  CURLUcode getResult;
  char *gateway = NULL;
  char *gwhost = NULL;
  char *gwpath = NULL;
  char *gwquery = NULL;
  char *gwscheme = NULL;
  char *gwport = NULL;
  char *inputpath = NULL;
  char *cid = NULL;
  char *pathbuffer = NULL;
  char *cloneurl;
  CURLU *gatewayurl = curl_url();

  if(!gatewayurl) {
    result = CURLE_FAILED_INIT;
    goto clean;
  }

  getResult = curl_url_get(uh, CURLUPART_HOST, &cid, CURLU_URLDECODE);
  if(getResult || !cid)
    goto clean;

  /* We might have a --ipfs-gateway argument. Check it first and use it. Error
   * if we do have something but if it is an invalid url.
   */
  if(config->ipfs_gateway) {
    /* ensure the gateway ends in a trailing / */
    if(ensure_trailing_slash(&config->ipfs_gateway) != CURLE_OK) {
      result = CURLE_OUT_OF_MEMORY;
      goto clean;
    }

    if(!curl_url_set(gatewayurl, CURLUPART_URL, config->ipfs_gateway,
                    CURLU_GUESS_SCHEME)) {
      gateway = strdup(config->ipfs_gateway);
      if(!gateway) {
        result = CURLE_URL_MALFORMAT;
        goto clean;
      }

    }
    else {
      result = CURLE_BAD_FUNCTION_ARGUMENT;
      goto clean;
    }
  }
  else {
    /* this is ensured to end in a trailing / within ipfs_gateway() */
    gateway = ipfs_gateway();
    if(!gateway) {
      result = CURLE_FILE_COULDNT_READ_FILE;
      goto clean;
    }

    if(curl_url_set(gatewayurl, CURLUPART_URL, gateway, 0)) {
      result = CURLE_URL_MALFORMAT;
      goto clean;
    }
  }

  /* check for unsupported gateway parts */
  if(curl_url_get(gatewayurl, CURLUPART_QUERY, &gwquery, 0)
                  != CURLUE_NO_QUERY) {
    result = CURLE_URL_MALFORMAT;
    goto clean;
  }

  /* get gateway parts */
  if(curl_url_get(gatewayurl, CURLUPART_HOST,
                  &gwhost, CURLU_URLDECODE)) {
    goto clean;
  }

  if(curl_url_get(gatewayurl, CURLUPART_SCHEME,
                  &gwscheme, CURLU_URLDECODE)) {
    goto clean;
  }

  curl_url_get(gatewayurl, CURLUPART_PORT, &gwport, CURLU_URLDECODE);
  curl_url_get(gatewayurl, CURLUPART_PATH, &gwpath, CURLU_URLDECODE);

  /* get the path from user input */
  curl_url_get(uh, CURLUPART_PATH, &inputpath, CURLU_URLDECODE);
  /* inputpath might be NULL or a valid pointer now */

  /* set gateway parts in input url */
  if(curl_url_set(uh, CURLUPART_SCHEME, gwscheme, CURLU_URLENCODE) ||
     curl_url_set(uh, CURLUPART_HOST, gwhost, CURLU_URLENCODE) ||
     curl_url_set(uh, CURLUPART_PORT, gwport, CURLU_URLENCODE))
    goto clean;

  /* if the input path is just a slash, clear it */
  if(inputpath && (inputpath[0] == '/') && !inputpath[1])
    *inputpath = '\0';

  /* ensure the gateway path ends with a trailing slash */
  ensure_trailing_slash(&gwpath);

  pathbuffer = aprintf("%s%s/%s%s", gwpath, protocol, cid,
                       inputpath ? inputpath : "");
  if(!pathbuffer) {
    goto clean;
  }

  if(curl_url_set(uh, CURLUPART_PATH, pathbuffer, CURLU_URLENCODE)) {
    goto clean;
  }

  /* Free whatever it has now, rewriting is next */
  curlx_safefree(*url);

  if(curl_url_get(uh, CURLUPART_URL, &cloneurl, CURLU_URLENCODE)) {
    goto clean;
  }
  /* we need to strdup the URL so that we can call free() on it later */
  *url = strdup(cloneurl);
  curl_free(cloneurl);
  if(!*url)
    goto clean;

  result = CURLE_OK;

clean:
  free(gateway);
  curl_free(gwhost);
  curl_free(gwpath);
  curl_free(gwquery);
  curl_free(inputpath);
  curl_free(gwscheme);
  curl_free(gwport);
  curl_free(cid);
  curl_free(pathbuffer);
  curl_url_cleanup(gatewayurl);
  {
    switch(result) {
    case CURLE_URL_MALFORMAT:
      helpf(tool_stderr, "malformed target URL");
      break;
    case CURLE_FILE_COULDNT_READ_FILE:
      helpf(tool_stderr, "IPFS automatic gateway detection failed");
      break;
    case CURLE_BAD_FUNCTION_ARGUMENT:
      helpf(tool_stderr, "--ipfs-gateway was given a malformed URL");
      break;
    default:
      break;
    }
  }
  return result;
}